

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O1

pair<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>
* __thiscall
jessilib::
split_once<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,wchar_t>
          (pair<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          begin,__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                end,wchar_t in_delim)

{
  long lVar1;
  long lVar2;
  
  if (begin._M_current <= this) {
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (wchar_t *)0x0;
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (wchar_t *)0x0;
    return __return_storage_ptr__;
  }
  lVar2 = 0;
  do {
    if (*(int *)(this + lVar2) == (int)end._M_current) {
      (__return_storage_ptr__->first)._M_len = lVar2 >> 2;
      (__return_storage_ptr__->first)._M_str = (wchar_t *)this;
      (__return_storage_ptr__->second)._M_len =
           (long)begin._M_current + (-lVar2 - (long)this) + -4 >> 2;
      (__return_storage_ptr__->second)._M_str = (wchar_t *)(this + lVar2 + 4);
      return __return_storage_ptr__;
    }
    lVar1 = lVar2 + 4;
    lVar2 = lVar2 + 4;
  } while (this + lVar1 != (jessilib *)begin._M_current);
  (__return_storage_ptr__->first)._M_len = (long)begin._M_current - (long)this >> 2;
  (__return_storage_ptr__->first)._M_str = (wchar_t *)this;
  (__return_storage_ptr__->second)._M_len = 0;
  (__return_storage_ptr__->second)._M_str = (wchar_t *)0x0;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}